

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O3

void __thiscall
vkt::Draw::anon_unknown_0::
DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams>::generateDrawData
          (DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndexedIndirectParams> *this)

{
  int iVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pPVar4;
  pointer pPVar5;
  deUint32 dVar6;
  long lVar7;
  pointer pVVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  size_type sVar14;
  ulong uVar15;
  pointer pVVar16;
  float fVar17;
  Random rnd;
  undefined8 uStack_d0;
  undefined1 local_c8 [8];
  pointer pPStack_c0;
  pointer local_b8;
  float local_a8;
  float local_98 [4];
  undefined1 local_88 [8];
  pointer puStack_80;
  pointer local_78;
  float afStack_70 [2];
  deRandom local_68;
  float local_58;
  float local_48;
  
  pVVar16 = (this->m_data).commands.
            super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uStack_d0 = 0x6e169e;
  deRandom_init(&local_68,pVVar16->firstIndex ^ pVVar16->indexCount ^ 0xc2a39f);
  sVar14 = 0;
  for (pVVar16 = (this->m_data).commands.
                 super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pVVar16 !=
      (this->m_data).commands.
      super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish; pVVar16 = pVVar16 + 1) {
    uVar12 = pVVar16->indexCount + pVVar16->firstIndex;
    uVar15 = (ulong)uVar12;
    if (uVar12 <= (uint)sVar14) {
      uVar15 = sVar14;
    }
    sVar14 = uVar15;
  }
  local_c8 = (undefined1  [8])((ulong)(uint)local_c8._4_4_ << 0x20);
  uStack_d0 = 0x6e16e5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,sVar14,
             (value_type_conflict1 *)local_c8,(allocator_type *)local_98);
  puVar2 = (this->m_data).super_IndexedParamsBase.indexes.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->m_data).super_IndexedParamsBase.indexes.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->m_data).super_IndexedParamsBase.indexes.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_88;
  (this->m_data).super_IndexedParamsBase.indexes.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = puStack_80;
  (this->m_data).super_IndexedParamsBase.indexes.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_78;
  local_88 = (undefined1  [8])0x0;
  puStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    uStack_d0 = 0x6e1725;
    operator_delete(puVar2,(long)puVar3 - (long)puVar2);
    if (local_88 != (undefined1  [8])0x0) {
      uStack_d0 = 0x6e173c;
      operator_delete((void *)local_88,(long)local_78 - (long)local_88);
    }
  }
  pVVar16 = (this->m_data).commands.
            super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar8 = (this->m_data).commands.
           super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar16 == pVVar8) {
    sVar14 = 1;
  }
  else {
    uVar12 = 0;
    do {
      if (pVVar16->indexCount != 0) {
        uVar10 = 0;
        do {
          iVar1 = pVVar16->vertexOffset;
          uStack_d0 = 0x6e176d;
          dVar6 = deRandom_getUint32(&local_68);
          uVar9 = dVar6 % (0x2711U - iVar1) + iVar1;
          uVar13 = pVVar16->vertexOffset + uVar9;
          if (uVar13 <= uVar12) {
            uVar13 = uVar12;
          }
          uVar12 = uVar13;
          (this->m_data).super_IndexedParamsBase.indexes.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[pVVar16->firstIndex + uVar10] = uVar9;
          uVar10 = uVar10 + 1;
        } while (uVar10 < pVVar16->indexCount);
        pVVar8 = (this->m_data).commands.
                 super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      pVVar16 = pVVar16 + 1;
    } while (pVVar16 != pVVar8);
    sVar14 = (size_type)(uVar12 + 1);
  }
  local_78 = (pointer)0x0;
  afStack_70[0] = 0.0;
  afStack_70[1] = 0.0;
  local_88 = (undefined1  [8])0x0;
  puStack_80 = (pointer)0x0;
  uStack_d0 = 0x6e17d8;
  std::vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>::
  vector((vector<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_> *)
         local_c8,sVar14,(value_type *)local_88,(allocator_type *)local_98);
  pPVar4 = (this->m_data).super_DrawParamsBase.vertices.
           super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar5 = (this->m_data).super_DrawParamsBase.vertices.
           super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_data).super_DrawParamsBase.vertices.
  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_c8;
  (this->m_data).super_DrawParamsBase.vertices.
  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_finish = pPStack_c0;
  (this->m_data).super_DrawParamsBase.vertices.
  super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_b8;
  local_c8 = (undefined1  [8])0x0;
  pPStack_c0 = (pointer)0x0;
  local_b8 = (pointer)0x0;
  if (pPVar4 != (pointer)0x0) {
    uStack_d0 = 0x6e1818;
    operator_delete(pPVar4,(long)pPVar5 - (long)pPVar4);
    if (local_c8 != (undefined1  [8])0x0) {
      uStack_d0 = 0x6e182e;
      operator_delete((void *)local_c8,(long)local_b8 - (long)local_c8);
    }
  }
  pVVar16 = (this->m_data).commands.
            super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pVVar8 = (this->m_data).commands.
           super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar16 != pVVar8) {
    do {
      uVar12 = pVVar16->firstIndex;
      uVar15 = (ulong)uVar12;
      uVar10 = pVVar16->indexCount + uVar12;
      if (uVar12 < uVar10) {
        do {
          iVar1 = pVVar16->vertexOffset;
          pPVar4 = (this->m_data).super_DrawParamsBase.vertices.
                   super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = (ulong)(this->m_data).super_IndexedParamsBase.indexes.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar15];
          puStack_80 = (pointer)0x100000000;
          local_78 = (pointer)0x300000002;
          uStack_d0 = 0x6e1895;
          local_a8 = deRandom_getFloat(&local_68);
          uStack_d0 = 0x6e18a2;
          fVar17 = deRandom_getFloat(&local_68);
          local_c8._4_4_ = fVar17 + fVar17 + -1.0;
          local_c8._0_4_ = local_a8 + local_a8 + -1.0;
          pPStack_c0 = (pointer)0x3f8000003f800000;
          lVar7 = 2;
          do {
            *(undefined4 *)
             ((long)(pPVar4 + (long)iVar1 + uVar11) + (long)*(int *)(local_88 + lVar7 * 4) * 4) =
                 *(undefined4 *)((long)&uStack_d0 + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 6);
          pPStack_c0 = (pointer)0x100000000;
          local_b8 = (pointer)0x300000002;
          uStack_d0 = 0x6e18f3;
          local_a8 = deRandom_getFloat(&local_68);
          uStack_d0 = 0x6e1900;
          local_48 = deRandom_getFloat(&local_68);
          uStack_d0 = 0x6e1910;
          local_58 = deRandom_getFloat(&local_68);
          uStack_d0 = 0x6e191d;
          fVar17 = deRandom_getFloat(&local_68);
          local_98[0] = local_a8 + 0.0;
          local_98[1] = local_48 + 0.0;
          local_98[2] = local_58 + 0.0;
          local_98[3] = fVar17 + 0.0;
          lVar7 = 2;
          do {
            *(float *)((long)(pPVar4 + (long)iVar1 + uVar11) + 0x10U +
                      (long)*(int *)(local_c8 + lVar7 * 4) * 4) = local_98[lVar7 + -2];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 6);
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar10);
        pVVar8 = (this->m_data).commands.
                 super__Vector_base<vk::VkDrawIndexedIndirectCommand,_std::allocator<vk::VkDrawIndexedIndirectCommand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      pVVar16 = pVVar16 + 1;
    } while (pVVar16 != pVVar8);
  }
  return;
}

Assistant:

void DrawTestInstance<DrawIndexedIndirectParams>::generateDrawData (void)
{
	de::Random		rnd			(SEED ^ m_data.commands[0].firstIndex ^ m_data.commands[0].indexCount);

	deUint32		lastIndex	= 0;

	// Get the maximum range of indexes
	for (std::vector<vk::VkDrawIndexedIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		const deUint32	index		= it->firstIndex + it->indexCount;
						lastIndex	= (index > lastIndex) ? index : lastIndex;
	}

	// Initialize the vector with zeros
	m_data.indexes = std::vector<deUint32>(lastIndex, 0);

	deUint32	highestIndex	= 0;

	// Generate random indexes for the ranges
	for (std::vector<vk::VkDrawIndexedIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		for (deUint32 idx = 0; idx < it->indexCount; ++idx)
		{
			const deUint32	vertexIdx	= rnd.getInt(it->vertexOffset, INDEX_LIMIT);
			const deUint32	maxIndex	= vertexIdx + it->vertexOffset;

			highestIndex = (maxIndex > highestIndex) ? maxIndex : highestIndex;
			m_data.indexes[it->firstIndex + idx] = vertexIdx;
		}
	}

	// Initialize the vertex vector
	m_data.vertices = std::vector<PositionColorVertex>(highestIndex + 1, PositionColorVertex(tcu::Vec4(0.0, 0.0, 0.0, 0.0), tcu::Vec4(0.0, 0.0, 0.0, 0.0)));

	// Generate random vertices in the used locations
	for (std::vector<vk::VkDrawIndexedIndirectCommand>::const_iterator cmdIt = m_data.commands.begin(); cmdIt != m_data.commands.end(); ++cmdIt)
	{
		deUint32	firstIdx	= cmdIt->firstIndex;
		deUint32	lastIdx		= firstIdx + cmdIt->indexCount;

		for (deUint32 idx = firstIdx; idx < lastIdx; ++idx)
		{
			std::vector<PositionColorVertex>::iterator	vertexIt = m_data.vertices.begin() + cmdIt->vertexOffset + m_data.indexes[idx];

			tcu::VecAccess<float, 4, 4> positionAccess = vertexIt->position.xyzw();
			positionAccess = tcu::Vec4(rnd.getFloat(-1.0, 1.0), rnd.getFloat(-1.0, 1.0), 1.0, 1.0);

			tcu::VecAccess<float, 4, 4> colorAccess = vertexIt->color.xyzw();
			colorAccess = tcu::Vec4(rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0), rnd.getFloat(0.0, 1.0));
		}
	}
}